

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O3

int garray_getfloatwords(_garray *x,int *size,t_word **vec)

{
  _array *p_Var1;
  char *pcVar2;
  char *fmt;
  int elemsize;
  int yonset;
  int local_20;
  int local_1c;
  
  p_Var1 = garray_getarray_floatonly(x,&local_1c,&local_20);
  if (p_Var1 == (_array *)0x0) {
    pcVar2 = x->x_realname->s_name;
    fmt = "%s: needs floating-point \'y\' field";
  }
  else {
    if (local_20 == 8) {
      p_Var1 = garray_getarray(x);
      *size = p_Var1->a_n;
      p_Var1 = garray_getarray(x);
      *vec = (t_word *)p_Var1->a_vec;
      return 1;
    }
    pcVar2 = x->x_realname->s_name;
    fmt = "%s: has more than one field";
  }
  pd_error((void *)0x0,fmt,pcVar2);
  return 0;
}

Assistant:

int garray_getfloatwords(t_garray *x, int *size, t_word **vec)
{
    int yonset, elemsize;
    t_array *a = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!a)
    {
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
        return (0);
    }
    else if (elemsize != sizeof(t_word))
    {
        pd_error(0, "%s: has more than one field", x->x_realname->s_name);
        return (0);
    }
    *size = garray_npoints(x);
    *vec =  (t_word *)garray_vec(x);
    return (1);
}